

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O2

decNumber_conflict * decTrim(decNumber_conflict *dn,decContext *set,uint8_t all,int32_t *dropped)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int shift;
  uint uVar4;
  uint16_t *puVar5;
  int iVar6;
  int iVar7;
  
  *dropped = 0;
  if (((dn->bits & 0x70) == 0) && ((dn->lsu[0] & 1) == 0)) {
    iVar1 = dn->digits;
    if (iVar1 != 1 || dn->lsu[0] != 0) {
      iVar2 = 1;
      if (1 < iVar1) {
        iVar2 = iVar1;
      }
      iVar6 = 0;
      uVar3 = 1;
      puVar5 = dn->lsu;
      iVar7 = dn->exponent;
      do {
        shift = iVar2 + -1;
        if ((iVar2 + -1 == iVar6) ||
           (uVar4 = (uint)uVar3, shift = iVar6,
           (ulong)((uint)(*puVar5 >> ((byte)uVar3 & 0x1f)) * multies[uVar3] >> 0x11) *
           DECPOWERS[uVar3] - (ulong)*puVar5 != 0)) goto LAB_009ad39b;
        if (iVar7 < 1 && all == '\0') {
          if (iVar7 == 0) {
LAB_009ad39b:
            if (shift == 0) {
              return dn;
            }
            if (set->clamp != '\0') {
              iVar2 = (set->emax - (dn->exponent + set->digits)) + 1;
              if (iVar2 <= shift) {
                shift = iVar2;
              }
              if (iVar2 < 1) {
                return dn;
              }
            }
            if (iVar1 < 0x32) {
              uVar4 = (uint)""[iVar1];
            }
            else {
              uVar4 = (iVar1 + 2U) / 3;
            }
            decShiftToLeast(dn->lsu,uVar4,shift);
            dn->exponent = dn->exponent + shift;
            dn->digits = dn->digits - shift;
            *dropped = shift;
            return dn;
          }
          iVar7 = iVar7 + 1;
        }
        uVar3 = (ulong)(uVar4 + 1);
        if (2 < uVar4) {
          uVar3 = 1;
        }
        puVar5 = puVar5 + (2 < uVar4);
        iVar6 = iVar6 + 1;
      } while( true );
    }
    dn->exponent = 0;
  }
  return dn;
}

Assistant:

static decNumber * decTrim(decNumber *dn, decContext *set, Flag all,
			   Int *dropped) {
  Int	d, exp;			   /* work */
  uInt	cut;			   /* .. */
  Unit	*up;			   /* -> current Unit */

  #if DECCHECK
  if (decCheckOperands(dn, DECUNUSED, DECUNUSED, DECUNCONT)) return dn;
  #endif

  *dropped=0;				/* assume no zeros dropped */
  if ((dn->bits & DECSPECIAL)		/* fast exit if special .. */
    || (*dn->lsu & 0x01)) return dn;	/* .. or odd */
  if (ISZERO(dn)) {			/* .. or 0 */
    dn->exponent=0;			/* (sign is preserved) */
    return dn;
    }

  /* have a finite number which is even */
  exp=dn->exponent;
  cut=1;			   /* digit (1-DECDPUN) in Unit */
  up=dn->lsu;			   /* -> current Unit */
  for (d=0; d<dn->digits-1; d++) { /* [don't strip the final digit] */
    /* slice by powers */
    #if DECDPUN<=4
      uInt quot=QUOT10(*up, cut);
      if ((*up-quot*powers[cut])!=0) break;  /* found non-0 digit */
    #else
      if (*up%powers[cut]!=0) break;	     /* found non-0 digit */
    #endif
    /* have a trailing 0 */
    if (!all) {			   /* trimming */
      /* [if exp>0 then all trailing 0s are significant for trim] */
      if (exp<=0) {		   /* if digit might be significant */
	if (exp==0) break;	   /* then quit */
	exp++;			   /* next digit might be significant */
	}
      }
    cut++;			   /* next power */
    if (cut>DECDPUN) {		   /* need new Unit */
      up++;
      cut=1;
      }
    } /* d */
  if (d==0) return dn;		   /* none to drop */

  /* may need to limit drop if clamping */
  if (set->clamp) {
    Int maxd=set->emax-set->digits+1-dn->exponent;
    if (maxd<=0) return dn;	   /* nothing possible */
    if (d>maxd) d=maxd;
    }

  /* effect the drop */
  decShiftToLeast(dn->lsu, D2U(dn->digits), d);
  dn->exponent+=d;		   /* maintain numerical value */
  dn->digits-=d;		   /* new length */
  *dropped=d;			   /* report the count */
  return dn;
  }